

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

Value * __thiscall cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this)

{
  String *pSVar1;
  pointer pGVar2;
  Value *pVVar3;
  curl_version_info_data *pcVar4;
  mapped_type *pmVar5;
  string *platform;
  String *value;
  __node_base *p_Var6;
  cmake *this_00;
  pointer value_00;
  Value supportedPlatforms;
  Value generators;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  JsonValueMapType generatorMap;
  Value local_58;
  
  this_00 = (cmake *)0x7;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  ReportVersionJson((Value *)&generatorMap,this_00);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar3,(Value *)&generatorMap);
  Json::Value::~Value((Value *)&generatorMap);
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  generatorInfoList.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&generatorInfoList,true);
  pcVar4 = curl_version_info(CURLVERSION_FIRST);
  pGVar2 = generatorInfoList.
           super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  generatorMap._M_h._M_buckets = &generatorMap._M_h._M_single_bucket;
  generatorMap._M_h._M_bucket_count = 1;
  p_Var6 = &generatorMap._M_h._M_before_begin;
  generatorMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  generatorMap._M_h._M_element_count = 0;
  generatorMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  generatorMap._M_h._M_rehash_policy._M_next_resize = 0;
  generatorMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (value_00 = generatorInfoList.
                  super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; value_00 != pGVar2;
      value_00 = value_00 + 1) {
    if (value_00->isAlias == false) {
      if ((value_00->extraName)._M_string_length == 0) {
        Json::Value::Value(&generators,objectValue);
        Json::Value::Value(&supportedPlatforms,&value_00->name);
        pVVar3 = Json::Value::operator[](&generators,"name");
        Json::Value::operator=(pVVar3,&supportedPlatforms);
        Json::Value::~Value(&supportedPlatforms);
        Json::Value::Value(&supportedPlatforms,value_00->supportsToolset);
        pVVar3 = Json::Value::operator[](&generators,"toolsetSupport");
        Json::Value::operator=(pVVar3,&supportedPlatforms);
        Json::Value::~Value(&supportedPlatforms);
        Json::Value::Value(&supportedPlatforms,value_00->supportsPlatform);
        pVVar3 = Json::Value::operator[](&generators,"platformSupport");
        Json::Value::operator=(pVVar3,&supportedPlatforms);
        Json::Value::~Value(&supportedPlatforms);
        if ((value_00->supportedPlatforms).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (value_00->supportedPlatforms).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          Json::Value::Value(&supportedPlatforms,arrayValue);
          pSVar1 = (value_00->supportedPlatforms).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (value = (value_00->supportedPlatforms).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; value != pSVar1; value = value + 1
              ) {
            Json::Value::Value(&local_58,value);
            Json::Value::append(&supportedPlatforms,&local_58);
            Json::Value::~Value(&local_58);
          }
          pVVar3 = Json::Value::operator[](&generators,"supportedPlatforms");
          Json::Value::operator=(pVVar3,&supportedPlatforms);
          Json::Value::~Value(&supportedPlatforms);
        }
        Json::Value::Value(&supportedPlatforms,arrayValue);
        pVVar3 = Json::Value::operator[](&generators,"extraGenerators");
        Json::Value::operator=(pVVar3,&supportedPlatforms);
        Json::Value::~Value(&supportedPlatforms);
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&generatorMap,&value_00->name);
        Json::Value::operator=(pmVar5,&generators);
      }
      else {
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&generatorMap,&value_00->baseName);
        pVVar3 = Json::Value::operator[](pmVar5,"extraGenerators");
        Json::Value::Value(&generators,&value_00->extraName);
        Json::Value::append(pVVar3,&generators);
      }
      Json::Value::~Value(&generators);
    }
  }
  Json::Value::Value(&generators,arrayValue);
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    Json::Value::append(&generators,(Value *)(p_Var6 + 5));
  }
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar3,&generators);
  cmFileAPI::ReportCapabilities();
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"fileApi");
  Json::Value::operator=(pVVar3,&supportedPlatforms);
  Json::Value::~Value(&supportedPlatforms);
  Json::Value::Value(&supportedPlatforms,false);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar3,&supportedPlatforms);
  Json::Value::~Value(&supportedPlatforms);
  Json::Value::Value(&supportedPlatforms,SUB41((pcVar4->features & 4U) >> 2,0));
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"tls");
  Json::Value::operator=(pVVar3,&supportedPlatforms);
  Json::Value::~Value(&supportedPlatforms);
  Json::Value::~Value(&generators);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&generatorMap._M_h);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
            (&generatorInfoList);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson() const
{
  Json::Value obj = Json::objectValue;

  // Version information:
  obj["version"] = this->ReportVersionJson();

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  auto* curlVersion = curl_version_info(CURLVERSION_FIRST);

  JsonValueMapType generatorMap;
  for (cmake::GeneratorInfo const& gi : generatorInfoList) {
    if (gi.isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (gi.extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = gi.name;
      gen["toolsetSupport"] = gi.supportsToolset;
      gen["platformSupport"] = gi.supportsPlatform;
      if (!gi.supportedPlatforms.empty()) {
        Json::Value supportedPlatforms = Json::arrayValue;
        for (std::string const& platform : gi.supportedPlatforms) {
          supportedPlatforms.append(platform);
        }
        gen["supportedPlatforms"] = std::move(supportedPlatforms);
      }
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[gi.name] = gen;
    } else {
      Json::Value& gen = generatorMap[gi.baseName];
      gen["extraGenerators"].append(gi.extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (auto const& i : generatorMap) {
    generators.append(i.second);
  }
  obj["generators"] = generators;
  obj["fileApi"] = cmFileAPI::ReportCapabilities();
  obj["serverMode"] = false;
  obj["tls"] = static_cast<bool>(curlVersion->features & CURL_VERSION_SSL);

  return obj;
}